

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_706387::RSATest_CheckFIPS_Test::TestBody(RSATest_CheckFIPS_Test *this)

{
  int iVar1;
  char *in_R9;
  AssertHelper local_60;
  UniquePtr<RSA> pub;
  AssertHelper local_50;
  string local_48;
  AssertionResult gtest_ar_;
  UniquePtr<RSA> rsa;
  
  rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes((uint8_t *)&(anonymous_namespace)::kKey1,0x260);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<rsa_st_*,_bssl::internal::Deleter>)
       rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl != (_Head_base<0UL,_rsa_st_*,_false>)0x0;
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&pub);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)0x5222e5,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x229,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&pub);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_48);
    if ((__uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>)
        pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_0030b78f;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  iVar1 = RSA_check_fips((RSA *)rsa._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t
                                .super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&pub);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"RSA_check_fips(rsa.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x22a,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&pub);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_48);
    if ((__uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>)
        pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_public_key_from_bytes((anonymous_namespace)::kKey1Public,0x8c);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<rsa_st_*,_bssl::internal::Deleter>)
       pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl != (_Head_base<0UL,_rsa_st_*,_false>)0x0;
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"pub","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x22f,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
LAB_0030b759:
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_48);
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = RSA_check_fips((RSA *)pub._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"RSA_check_fips(pub.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
                 ,0x230,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
      goto LAB_0030b759;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&pub);
LAB_0030b78f:
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&rsa);
  return;
}

Assistant:

TEST(RSATest, CheckFIPS) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);
  EXPECT_TRUE(RSA_check_fips(rsa.get()));

  // Check that RSA_check_fips works on a public key.
  bssl::UniquePtr<RSA> pub(
      RSA_public_key_from_bytes(kKey1Public, sizeof(kKey1Public)));
  ASSERT_TRUE(pub);
  EXPECT_TRUE(RSA_check_fips(pub.get()));
}